

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

unit_data __thiscall units::detail::unit_data::operator*(unit_data *this,unit_data *other)

{
  uint *in_RSI;
  uint *in_RDI;
  unit_data local_34;
  
  unit_data(&local_34,((int)(*in_RDI << 0x1c) >> 0x1c) + ((int)(*in_RSI << 0x1c) >> 0x1c),
            ((int)(*in_RDI << 0x15) >> 0x1d) + ((int)(*in_RSI << 0x15) >> 0x1d),
            ((int)(*in_RDI << 0x18) >> 0x1c) + ((int)(*in_RSI << 0x18) >> 0x1c),
            ((int)(*in_RDI << 0x12) >> 0x1d) + ((int)(*in_RSI << 0x12) >> 0x1d),
            ((int)(*in_RDI << 0xd) >> 0x1d) + ((int)(*in_RSI << 0xd) >> 0x1d),
            ((int)(*in_RDI << 0xb) >> 0x1e) + ((int)(*in_RSI << 0xb) >> 0x1e),
            ((int)(*in_RDI << 0x10) >> 0x1e) + ((int)(*in_RSI << 0x10) >> 0x1e),
            ((int)(*in_RDI << 6) >> 0x1e) + ((int)(*in_RSI << 6) >> 0x1e),
            ((int)(*in_RDI << 4) >> 0x1e) + ((int)(*in_RSI << 4) >> 0x1e),
            ((int)(*in_RDI << 8) >> 0x1d) + ((int)(*in_RSI << 8) >> 0x1d),
            *in_RDI >> 0x1c & 1 | *in_RSI >> 0x1c & 1,*in_RDI >> 0x1d & 1 ^ *in_RSI >> 0x1d & 1,
            *in_RDI >> 0x1e & 1 | *in_RSI >> 0x1e & 1,(*in_RDI | *in_RSI) >> 0x1f);
  return local_34;
}

Assistant:

constexpr unit_data operator*(const unit_data& other) const
        {
            return {
                meter_ + other.meter_,
                kilogram_ + other.kilogram_,
                second_ + other.second_,
                ampere_ + other.ampere_,
                kelvin_ + other.kelvin_,
                mole_ + other.mole_,
                candela_ + other.candela_,
                currency_ + other.currency_,
                count_ + other.count_,
                radians_ + other.radians_,
                static_cast<unsigned int>(per_unit_ | other.per_unit_),
                static_cast<unsigned int>(i_flag_ ^ other.i_flag_),
                static_cast<unsigned int>(e_flag_ | other.e_flag_),
                static_cast<unsigned int>(equation_ | other.equation_),
            };
        }